

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O0

void __thiscall urllib::Request::parseUrl(Request *this)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  byte *in_RDI;
  size_type pos;
  string tmp;
  difference_type in_stack_fffffffffffffe70;
  string *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  allocator<char> *in_stack_fffffffffffffe88;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  allocator<char> local_139;
  undefined8 local_138;
  undefined8 local_130;
  char *local_128;
  string local_120 [39];
  undefined1 local_f9 [57];
  long local_c0;
  allocator<char> local_b1;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  string local_98 [55];
  allocator<char> local_61;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  string local_48 [32];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [5];
  
  lVar2 = std::__cxx11::string::find((char *)(in_RDI + 8),0x10e03f);
  if (lVar2 == -1) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(in_RDI + 8));
    poVar3 = std::operator<<(poVar3,": is not a valid URL.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  uVar4 = std::__cxx11::string::size();
  if (0x5dc < uVar4) {
    poVar3 = std::operator<<((ostream *)&std::cout,"url is too long.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  iVar1 = std::__cxx11::string::compare((ulong)(in_RDI + 8),0,(char *)0x7);
  if (iVar1 == 0) {
    *in_RDI = 1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((ulong)(in_RDI + 8),0,(char *)0x8);
    if (iVar1 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Only HTTP/HTTPS protocol is directly supported.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(2);
    }
    *in_RDI = 0;
  }
  std::__cxx11::string::string((string *)local_28);
  if ((*in_RDI & 1) == 0) {
    in_stack_fffffffffffffe98._M_current = (char *)(in_RDI + 8);
    local_a8 = std::__cxx11::string::begin();
    local_a0 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    local_b0 = std::__cxx11::string::end();
    in_stack_fffffffffffffea0._M_current = (char *)&local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe88);
    std::__cxx11::string::operator=((string *)local_28,local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_b1);
  }
  else {
    local_58 = std::__cxx11::string::begin();
    local_50 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    local_60 = std::__cxx11::string::end();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe88);
    std::__cxx11::string::operator=((string *)local_28,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_61);
  }
  local_c0 = std::__cxx11::string::find((char *)local_28,0x10e041);
  if (local_c0 == -1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x28),(string *)local_28);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x48),"/");
  }
  else {
    __a = (allocator<char> *)local_28;
    local_f9._17_8_ = std::__cxx11::string::begin();
    local_f9._1_8_ = std::__cxx11::string::begin();
    local_f9._9_8_ =
         __gnu_cxx::
         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (this_02,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,__a);
    this_00 = (string *)(local_f9 + 0x19);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x28),this_00);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator((allocator<char> *)local_f9);
    this_01 = local_28;
    local_130 = std::__cxx11::string::begin();
    local_128 = (char *)__gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+(this_01,(difference_type)this_00);
    local_138 = std::__cxx11::string::end();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (this_02,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,__a);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x48),local_120);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_139);
  }
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void Request::parseUrl()
{
    if (url_.find("://") == string::npos)
    {
        cout << url_ << ": is not a valid URL." << endl;
        exit(2);
    }

    if (url_.size() > 1500)
    {
        cout << "url is too long." << endl;
        exit(2);
    }

    if (url_.compare(0, 7, "http://") == 0)
    {
        isHTTP_ = true;    
    }
    else if (url_.compare(0, 8, "https://") == 0)
    {
        isHTTP_ = false;
    }
    else
    {
        cout << "Only HTTP/HTTPS protocol is directly supported." << endl;
        exit(2);
    }

    string tmp;

    if (isHTTP_)
        tmp = string(url_.begin()+7, url_.end());   // remove "http://"
    else
        tmp = string(url_.begin()+8, url_.end());   // remove "https://"

    auto pos = tmp.find("/");
    if (pos == string::npos)
    {
        host_ = tmp;
        uri_ = "/";
    }
    else
    {
        host_ = string(tmp.begin(), tmp.begin()+pos);
        uri_ = string(tmp.begin()+pos, tmp.end());
    }
}